

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packer.cpp
# Opt level: O1

void __thiscall CPacker::AddRaw(CPacker *this,void *pData,int Size)

{
  uchar uVar1;
  uchar *puVar2;
  long lVar3;
  
  if (this->m_Error == 0) {
    if (this->m_pEnd <= this->m_pCurrent + Size) {
      this->m_Error = 1;
      return;
    }
    if (Size != 0) {
      lVar3 = 0;
      do {
        uVar1 = *(uchar *)((long)pData + lVar3);
        puVar2 = this->m_pCurrent;
        this->m_pCurrent = puVar2 + 1;
        *puVar2 = uVar1;
        lVar3 = lVar3 + 1;
      } while (Size != (int)lVar3);
    }
  }
  return;
}

Assistant:

void CPacker::AddRaw(const void *pData, int Size)
{
	if(m_Error)
		return;

	if(m_pCurrent+Size >= m_pEnd)
	{
		m_Error = 1;
		return;
	}

	const unsigned char *pSrc = (const unsigned char *)pData;
	while(Size)
	{
		*m_pCurrent++ = *pSrc++;
		Size--;
	}
}